

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

vector<Chainstate_*,_std::allocator<Chainstate_*>_> * __thiscall
ChainstateManager::GetAll(ChainstateManager *this)

{
  long lVar1;
  const_iterator ppCVar2;
  const_iterator ppCVar3;
  undefined8 in_RSI;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<Chainstate_*> *__range1;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *out;
  Chainstate *cs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  initializer_list<Chainstate_*> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,(int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_ffffffffffffff58);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)in_stack_ffffffffffffff58);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)in_stack_ffffffffffffff58);
  ppCVar2 = std::initializer_list<Chainstate_*>::begin(in_stack_ffffffffffffff58);
  ppCVar3 = std::initializer_list<Chainstate_*>::end((initializer_list<Chainstate_*> *)in_RDI);
  for (; ppCVar2 != ppCVar3; ppCVar2 = ppCVar2 + 1) {
    in_stack_ffffffffffffff67 =
         IsUsable(in_RDI,(Chainstate *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
                 );
    if ((bool)in_stack_ffffffffffffff67) {
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::push_back
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_RDI,
                 (value_type *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Chainstate*> ChainstateManager::GetAll()
{
    LOCK(::cs_main);
    std::vector<Chainstate*> out;

    for (Chainstate* cs : {m_ibd_chainstate.get(), m_snapshot_chainstate.get()}) {
        if (this->IsUsable(cs)) out.push_back(cs);
    }

    return out;
}